

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform_hwloc.cpp
# Opt level: O0

bool xmrig::Platform::setThreadAffinity(uint64_t cpu_id)

{
  int iVar1;
  HwlocCpuInfo *this;
  hwloc_obj_t phVar2;
  hwloc_topology_t phVar3;
  hwloc_obj_t pu;
  HwlocCpuInfo *cpu;
  undefined8 in_stack_ffffffffffffffe0;
  bool local_1;
  
  this = (HwlocCpuInfo *)Cpu::info();
  HwlocCpuInfo::topology(this);
  phVar2 = hwloc_get_pu_obj_by_os_index
                     ((hwloc_topology_t)this,(uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (phVar2 == (hwloc_obj_t)0x0) {
    local_1 = false;
  }
  else {
    phVar3 = HwlocCpuInfo::topology(this);
    iVar1 = hwloc_set_cpubind(phVar3,phVar2->cpuset,6);
    if (iVar1 < 0) {
      phVar3 = HwlocCpuInfo::topology(this);
      iVar1 = hwloc_set_cpubind(phVar3,phVar2->cpuset,2);
      local_1 = -1 < iVar1;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool xmrig::Platform::setThreadAffinity(uint64_t cpu_id)
{
    auto cpu       = static_cast<HwlocCpuInfo *>(Cpu::info());
    hwloc_obj_t pu = hwloc_get_pu_obj_by_os_index(cpu->topology(), static_cast<unsigned>(cpu_id));

    if (pu == nullptr) {
        return false;
    }

    if (hwloc_set_cpubind(cpu->topology(), pu->cpuset, HWLOC_CPUBIND_THREAD | HWLOC_CPUBIND_STRICT) >= 0) {
        return true;
    }

    return hwloc_set_cpubind(cpu->topology(), pu->cpuset, HWLOC_CPUBIND_THREAD) >= 0;
}